

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::AllocatorFlushThresholdSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  idx_t iVar1;
  TaskScheduler *this;
  string sStack_38;
  
  Value::ToString_abi_cxx11_(&sStack_38,input);
  iVar1 = DBConfig::ParseMemoryLimit(&sStack_38);
  (config->options).allocator_flush_threshold = iVar1;
  ::std::__cxx11::string::~string((string *)&sStack_38);
  if (db != (DatabaseInstance *)0x0) {
    this = TaskScheduler::GetScheduler(db);
    TaskScheduler::SetAllocatorFlushTreshold(this,(config->options).allocator_flush_threshold);
  }
  return;
}

Assistant:

void AllocatorFlushThresholdSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	config.options.allocator_flush_threshold = DBConfig::ParseMemoryLimit(input.ToString());
	if (db) {
		TaskScheduler::GetScheduler(*db).SetAllocatorFlushTreshold(config.options.allocator_flush_threshold);
	}
}